

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_rotate_Z(vec4 *Q,vec4 *M,float angle)

{
  float fVar1;
  float local_68;
  float local_64;
  mat4x4 R;
  float c;
  float s;
  float angle_local;
  vec4 *M_local;
  vec4 *Q_local;
  
  fVar1 = sinf(angle);
  local_68 = cosf(angle);
  R[0][0] = 0.0;
  R[0][1] = 0.0;
  R[0][2] = -fVar1;
  R[1][0] = 0.0;
  R[1][1] = 0.0;
  R[1][2] = 0.0;
  R[1][3] = 0.0;
  R[2][0] = 1.0;
  R[2][1] = 0.0;
  R[2][2] = 0.0;
  R[2][3] = 0.0;
  R[3][0] = 0.0;
  R[3][1] = 1.0;
  local_64 = fVar1;
  R[0][3] = local_68;
  R[3][3] = local_68;
  mat4x4_mul(Q,M,(vec4 *)&local_68);
  return;
}

Assistant:

static inline void mat4x4_rotate_Z(mat4x4 Q, mat4x4 M, float angle)
{
	float s = sinf(angle);
	float c = cosf(angle);
	mat4x4 R = {
		{   c,   s, 0.f, 0.f},
		{  -s,   c, 0.f, 0.f},
		{ 0.f, 0.f, 1.f, 0.f},
		{ 0.f, 0.f, 0.f, 1.f}
	};
	mat4x4_mul(Q, M, R);
}